

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speedtesting.cpp
# Opt level: O0

double hashALot<ThreeWiseHash<unsigned_int,unsigned_char>>
                 (int n,int L,uint ttimes,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *recorder,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  uchar uVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  uint local_4e0;
  uint k_1;
  uint local_4cc;
  undefined1 local_4c8 [4];
  uint k;
  ThreeWiseHash<unsigned_int,_unsigned_char> hf;
  undefined1 local_48 [4];
  uint times;
  ZTimer t;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *recorder_local;
  uint ttimes_local;
  int L_local;
  int n_local;
  
  t.t2.tv_usec = (__suseconds_t)data;
  ZTimer::ZTimer((ZTimer *)local_48);
  for (hf.hasher.hashvalues[0xff] = 0; hf.hasher.hashvalues[0xff] < ttimes;
      hf.hasher.hashvalues[0xff] = hf.hasher.hashvalues[0xff] + 1) {
    ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash
              ((ThreeWiseHash<unsigned_int,_unsigned_char> *)local_4c8,n,L);
    for (local_4cc = 0; local_4e0 = n, local_4cc < (uint)n; local_4cc = local_4cc + 1) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)t.t2.tv_usec,
                          (ulong)local_4cc);
      ThreeWiseHash<unsigned_int,_unsigned_char>::eat
                ((ThreeWiseHash<unsigned_int,_unsigned_char> *)local_4c8,*pvVar3);
    }
    for (; sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)t.t2.tv_usec)
        , local_4e0 < sVar4; local_4e0 = local_4e0 + 1) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)t.t2.tv_usec,
                          (ulong)(local_4e0 - n));
      uVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)t.t2.tv_usec,
                          (ulong)local_4e0);
      ThreeWiseHash<unsigned_int,_unsigned_char>::update
                ((ThreeWiseHash<unsigned_int,_unsigned_char> *)local_4c8,uVar1,*pvVar3);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (recorder,(value_type_conflict1 *)local_4c8);
    ThreeWiseHash<unsigned_int,_unsigned_char>::~ThreeWiseHash
              ((ThreeWiseHash<unsigned_int,_unsigned_char> *)local_4c8);
  }
  iVar2 = ZTimer::split((ZTimer *)local_48);
  return (double)iVar2 / 1000.0;
}

Assistant:

double hashALot(int n, int L, uint ttimes, vector<uint32> &recorder,
                vector<unsigned char> &data) {
  ZTimer t;
  for (uint times = 0; times < ttimes; ++times) {
    hashfunction hf(n, L);
    for (uint k = 0; k < static_cast<uint>(n); ++k) {
      hf.eat(data[k]);
    }
    for (uint k = n; k < data.size(); ++k) {
      hf.update(data[k - n], data[k]);
    }
    /* The goal of the recorder is to prevent
    the compiler from deciding that this whole computation
    is not required!
    */
    recorder.push_back(hf.hashvalue);
  }
  return t.split() / 1000.0;
}